

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ApiColumnText(Fts5Context *pCtx,int iCol,char **pz,int *pn)

{
  long lVar1;
  int iVar2;
  
  iVar2 = 0x19;
  if (-1 < iCol) {
    lVar1 = *(long *)pCtx;
    if (iCol < *(int *)(*(long *)(lVar1 + 0x18) + 0x20)) {
      if (*(int *)(*(long *)(lVar1 + 0x18) + 0x48) == 1) {
        *pz = (char *)0x0;
        *pn = 0;
        iVar2 = 0;
      }
      else {
        iVar2 = fts5SeekCursor((Fts5Cursor *)pCtx,0);
        if (iVar2 == 0) {
          iVar2 = fts5TextFromStmt(*(Fts5Config **)(lVar1 + 0x18),*(sqlite3_stmt **)(pCtx + 0x38),
                                   iCol,pz,pn);
          lVar1 = *(long *)(lVar1 + 0x18);
          *(undefined8 *)(lVar1 + 0xa8) = 0;
          *(undefined4 *)(lVar1 + 0xb0) = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int fts5ApiColumnText(
  Fts5Context *pCtx,
  int iCol,
  const char **pz,
  int *pn
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Table *pTab = (Fts5Table*)(pCsr->base.pVtab);

  assert( pCsr->ePlan!=FTS5_PLAN_SPECIAL );
  if( iCol<0 || iCol>=pTab->pConfig->nCol ){
    rc = SQLITE_RANGE;
  }else if( fts5IsContentless((Fts5FullTable*)(pCsr->base.pVtab), 0) ){
    *pz = 0;
    *pn = 0;
  }else{
    rc = fts5SeekCursor(pCsr, 0);
    if( rc==SQLITE_OK ){
      rc = fts5TextFromStmt(pTab->pConfig, pCsr->pStmt, iCol, pz, pn);
      sqlite3Fts5ClearLocale(pTab->pConfig);
    }
  }
  return rc;
}